

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  int iVar1;
  ulong a;
  ulong uVar2;
  uint64_t uVar3;
  int in_ESI;
  ulong *in_RDI;
  secp256k1_uint128 t;
  uint64_t nonzero;
  uint64_t mask;
  int vflag;
  uint in_stack_ffffffffffffffcc;
  secp256k1_uint128 *in_stack_ffffffffffffffd0;
  
  a = (ulong)-in_ESI;
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x12c4ee);
  uVar2 = (ulong)(int)((iVar1 != 0) - 1);
  secp256k1_scalar_verify((secp256k1_scalar *)0x12c50d);
  secp256k1_u128_from_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,*in_RDI ^ a);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,a & 0xbfd25e8cd0364142);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  *in_RDI = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDI[1] ^ a);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,a & 0xbaaedce6af48a03b);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI[1] = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDI[2] ^ a);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,a & 0xfffffffffffffffe);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI[2] = uVar3 & uVar2;
  secp256k1_u128_rshift(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDI[3] ^ a);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,a);
  uVar3 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI[3] = uVar3 & uVar2;
  secp256k1_scalar_verify((secp256k1_scalar *)0x12c648);
  return (uint)(a == 0) * 2 + -1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    volatile int vflag = flag;
    uint64_t mask = -vflag;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(r);

    secp256k1_u128_from_u64(&t, r->d[0] ^ mask);
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_0 + 1) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3 & mask);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
    return 2 * (mask == 0) - 1;
}